

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O1

EC_T_BOOL FindSlaveGetFixedAddr
                    (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_DWORD dwSlaveInstance,
                    EC_T_DWORD dwVendorId,EC_T_DWORD dwProductCode,EC_T_WORD *pwPhysAddr)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  short sVar4;
  uint uVar5;
  EC_T_DWORD EVar6;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  undefined1 local_9c [32];
  EC_T_DWORD local_7c;
  EC_T_DWORD local_78;
  EC_T_WORD local_64;
  
  iVar2 = emGetNumConnectedSlaves();
  if (iVar2 != 0) {
    sVar4 = 0;
    EVar6 = 0;
    uVar5 = 0;
    do {
      uVar3 = emGetBusSlaveInfo(dwInstanceID,0,sVar4,local_9c);
      if (uVar3 == 0) {
        bVar1 = false;
        if ((local_7c == dwVendorId) && (local_78 == dwProductCode)) {
          if (EVar6 == dwSlaveInstance) {
            *pwPhysAddr = local_64;
            bVar1 = true;
          }
          else {
            EVar6 = EVar6 + 1;
          }
        }
      }
      else {
        CAtEmLogging::LogError
                  (poLog,"PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x",(ulong)uVar3);
        bVar1 = false;
      }
      if (bVar1) {
        return 1;
      }
      uVar5 = uVar5 + 1;
      uVar3 = emGetNumConnectedSlaves(dwInstanceID);
      sVar4 = sVar4 + -1;
    } while (uVar5 < uVar3);
  }
  return 0;
}

Assistant:

EC_T_BOOL FindSlaveGetFixedAddr
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog
    ,EC_T_DWORD     dwSlaveInstance     /**< [in]   Slave instance (0 = first matching, 1 = second, ...) */
    ,EC_T_DWORD     dwVendorId          /**< [in]   Vendor Id of slave to search */
    ,EC_T_DWORD     dwProductCode       /**< [in]   Product Code of slave to search */
    ,EC_T_WORD*     pwPhysAddr)         /**< [out]  Physical Address of slave */
{
EC_T_DWORD dwRes              = EC_E_ERROR;
EC_T_DWORD dwSlaveIdx         = 0;
EC_T_DWORD dwSlaveInstanceCnt = 0;

    for (dwSlaveIdx = 0; dwSlaveIdx < emGetNumConnectedSlaves(dwInstanceID); dwSlaveIdx++)
    {
    EC_T_WORD           wAutoIncAddress = (EC_T_WORD)(0-dwSlaveIdx);
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;

        /* get information about bus slave */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            LogErr("PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x", dwRes);
            continue;
        }
        if ((oBusSlaveInfo.dwVendorId == dwVendorId) && (oBusSlaveInfo.dwProductCode == dwProductCode))
        {
            if (dwSlaveInstanceCnt == dwSlaveInstance)
            {
                /* slave found */
                *pwPhysAddr = oBusSlaveInfo.wStationAddress;
                return EC_TRUE;
            }
            dwSlaveInstanceCnt++;
        }
    }
    return EC_FALSE;
}